

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GetArrayOfStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  size_t t;
  pair<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar1;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string return_type;
  string local_e8;
  undefined1 local_c8 [8];
  ImportMapEntry import_entry;
  string local_78;
  undefined1 local_58 [8];
  Type vec_type;
  string *code;
  ImportMap *imports_local;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  vec_type._24_8_ = code_ptr;
  Type::VectorType((Type *)local_58,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  Namer::Method<flatbuffers::FieldDef>(&local_78,&(this->namer_).super_Namer,field);
  std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  GenPackageReference_abi_cxx11_(&local_e8,this,&(field->value).type);
  TypeName_abi_cxx11_((string *)((long)&return_type.field_2 + 8),this,field);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&return_type.field_2 + 8));
  std::__cxx11::string::~string((string *)(return_type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_e8);
  if (((((this->super_BaseGenerator).parser_)->opts).python_typing & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)vec_type._24_8_,"(self, i):");
  }
  else {
    ReturnType_abi_cxx11_((string *)local_128,this,struct_def,field);
    std::__cxx11::string::operator+=((string *)vec_type._24_8_,"(self, i: int)");
    std::operator+(&local_168," -> ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    std::operator+(&local_148,&local_168,":");
    std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    pVar1 = std::
            set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(imports,(value_type *)local_c8);
    local_178 = (_Base_ptr)pVar1.first._M_node;
    local_170 = pVar1.second;
    std::__cxx11::string::~string((string *)local_128);
  }
  if ((((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) &&
     (((((this->super_BaseGenerator).parser_)->opts).python_typing & 1U) == 0)) {
    GenIndents_abi_cxx11_(&local_198,this,2);
    std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator+(&local_218,"from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    std::operator+(&local_1f8,&local_218," import ");
    std::operator+(&local_1d8,&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&import_entry.first.field_2 + 8));
    std::operator+(&local_1b8,&local_1d8,"\n");
    std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
  }
  GenIndents_abi_cxx11_(&local_298,this,2);
  std::operator+(&local_278,&local_298,"obj = ");
  TypeName_abi_cxx11_(&local_2b8,this,field);
  std::operator+(&local_258,&local_278,&local_2b8);
  std::operator+(&local_238,&local_258,"()");
  std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  GenIndents_abi_cxx11_(&local_2f8,this,2);
  std::operator+(&local_2d8,&local_2f8,"obj.Init(self._tab.Bytes, self._tab.Pos + ");
  std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  NumToString<unsigned_short>(&local_338,(field->value).offset);
  std::operator+(&local_318,&local_338," + i * ");
  std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  t = InlineSize((Type *)local_58);
  NumToString<unsigned_long>(&local_358,t);
  std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  GenIndents_abi_cxx11_(&local_3b8,this,2);
  std::operator+(&local_398,")",&local_3b8);
  std::operator+(&local_378,&local_398,"return obj\n\n");
  std::__cxx11::string::operator+=((string *)vec_type._24_8_,(string *)&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_c8);
  return;
}

Assistant:

void GetArrayOfStruct(const StructDef &struct_def, const FieldDef &field,
                        std::string *code_ptr, ImportMap &imports) const {
    auto &code = *code_ptr;
    const auto vec_type = field.value.type.VectorType();
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);

    const ImportMapEntry import_entry = {
      GenPackageReference(field.value.type), TypeName(field)
    };

    if (parser_.opts.python_typing) {
      const std::string return_type = ReturnType(struct_def, field);
      code += "(self, i: int)";
      code += " -> " + return_type + ":";

      imports.insert(import_entry);
    } else {
      code += "(self, i):";
    }

    if (parser_.opts.include_dependence_headers &&
        !parser_.opts.python_typing) {
      code += GenIndents(2);
      code += "from " + import_entry.first + " import " + import_entry.second +
              "\n";
    }

    code += GenIndents(2) + "obj = " + TypeName(field) + "()";
    code += GenIndents(2) + "obj.Init(self._tab.Bytes, self._tab.Pos + ";
    code += NumToString(field.value.offset) + " + i * ";
    code += NumToString(InlineSize(vec_type));
    code += ")" + GenIndents(2) + "return obj\n\n";
  }